

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

sexp load_image_callback_p2(sexp ctx,sexp dstp,void *user)

{
  void *pvVar1;
  int *in_RSI;
  void *fn;
  sexp name;
  sexp res;
  long local_30;
  sexp local_8;
  
  if (((((ulong)in_RSI & 3) == 0) && (*in_RSI == 0x1b)) && (*(long *)(in_RSI + 0x1a) != 0)) {
    if (((*(long *)(in_RSI + 6) == 0) || ((*(ulong *)(in_RSI + 6) & 3) != 0)) ||
       (**(int **)(in_RSI + 6) != 9)) {
      local_30 = *(long *)(in_RSI + 2);
    }
    else {
      local_30 = *(long *)(in_RSI + 6);
    }
    if (local_30 == 0) {
      snprintf(gc_heap_err_str,0x100,"opcode func field missing function name");
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    pvVar1 = load_image_fn((sexp)user,res,name);
    if (pvVar1 == (void *)0x0) {
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    *(void **)(in_RSI + 0x1a) = pvVar1;
  }
  else if (((((ulong)in_RSI & 3) == 0) && (*in_RSI == 1)) && (*(long *)(in_RSI + 0x1c) != 0)) {
    if (*(long *)(in_RSI + 0x12) == 0) {
      snprintf(gc_heap_err_str,0x100,"type finalize field missing function name");
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    pvVar1 = load_image_fn((sexp)user,res,name);
    if (pvVar1 == (void *)0x0) {
      local_8 = (sexp)&DAT_0000003e;
      return local_8;
    }
    *(void **)(in_RSI + 0x1c) = pvVar1;
  }
  local_8 = (sexp)&DAT_0000013e;
  return local_8;
}

Assistant:

static sexp load_image_callback_p2 (sexp ctx, sexp dstp, void *user) {
  sexp res = NULL;
  sexp name = NULL;
  void *fn = NULL;

  if (sexp_opcodep(dstp) && sexp_opcode_func(dstp)) {
    if (sexp_opcode_data2(dstp) && sexp_stringp(sexp_opcode_data2(dstp))) {
      name = sexp_opcode_data2(dstp);
    } else {
      name = sexp_opcode_name(dstp);
    }
    if (!name) {
      snprintf(gc_heap_err_str, ERR_STR_SIZE, "opcode func field missing function name");
      return SEXP_FALSE;
    }
    
    fn = load_image_fn(ctx, sexp_opcode_dl(dstp), name);
    if (!fn) {
      return SEXP_FALSE;
    }
    sexp_opcode_func(dstp) = fn;
  
  } else if (sexp_typep(dstp) && sexp_type_finalize(dstp)) {
    name = sexp_type_finalize_name(dstp);
    if (!name) {
      snprintf(gc_heap_err_str, ERR_STR_SIZE, "type finalize field missing function name");
      return SEXP_FALSE;
    }
    fn = load_image_fn(ctx, sexp_type_dl(dstp), name);
    if (!fn) {
      return SEXP_FALSE;
    }
    sexp_type_finalize(dstp) = fn;
  }
  res = SEXP_TRUE;
  return res;
}